

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O3

void __thiscall QListWidgetItem::setData(QListWidgetItem *this,int role,QVariant *value)

{
  QListWidgetItemPrivate *pQVar1;
  QWidgetItemData *pQVar2;
  char cVar3;
  long lVar4;
  QListModel *__s;
  int *piVar5;
  pointer pQVar6;
  undefined8 *puVar7;
  long lVar8;
  undefined1 auVar9 [8];
  int iVar10;
  long lVar11;
  long in_FS_OFFSET;
  QArrayData *d;
  undefined1 local_68 [8];
  anon_union_24_3_e3d07ef4_for_data aStack_60;
  QModelIndex *local_38;
  
  local_38 = *(QModelIndex **)(in_FS_OFFSET + 0x28);
  iVar10 = 0;
  if (role != 2) {
    iVar10 = role;
  }
  pQVar1 = this->d;
  lVar4 = (pQVar1->values).d.size;
  if (lVar4 != 0) {
    pQVar2 = (pQVar1->values).d.ptr;
    lVar11 = -8;
    lVar8 = 0;
    do {
      if (*(int *)((long)&pQVar2->role + lVar8) == iVar10) {
        cVar3 = ::QVariant::equals((QVariant *)((long)pQVar2 - lVar11));
        if (cVar3 != '\0') goto LAB_0057ba29;
        pQVar6 = QList<QWidgetItemData>::data(&this->d->values);
        ::QVariant::operator=((QVariant *)((long)pQVar6 - lVar11),value);
        goto LAB_0057b906;
      }
      lVar11 = lVar11 + -0x28;
      lVar8 = lVar8 + 0x28;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  local_68._0_4_ = iVar10;
  ::QVariant::QVariant((QVariant *)&aStack_60,value);
  QtPrivate::QMovableArrayOps<QWidgetItemData>::emplace<QWidgetItemData>
            ((QMovableArrayOps<QWidgetItemData> *)&pQVar1->values,(pQVar1->values).d.size,
             (QWidgetItemData *)local_68);
  QList<QWidgetItemData>::end(&pQVar1->values);
  ::QVariant::~QVariant((QVariant *)&aStack_60);
LAB_0057b906:
  __s = listModel(this);
  if (__s != (QListModel *)0x0) {
    if (iVar10 == 0) {
      local_68 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      puVar7 = (undefined8 *)QArrayData::allocate((QArrayData **)local_68,4,0x10,2,KeepSize);
      *puVar7 = 0x200000000;
      auVar9 = local_68;
    }
    else {
      local_68 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      piVar5 = (int *)QArrayData::allocate((QArrayData **)local_68,4,0x10,1,KeepSize);
      *piVar5 = iVar10;
      auVar9 = local_68;
    }
    aStack_60._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    aStack_60.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    QListModel::index((QListModel *)local_68,(char *)__s,(int)this);
    QAbstractItemModel::dataChanged
              ((QModelIndex *)__s,(QModelIndex *)local_68,(QList_conflict *)local_68);
    if (auVar9 != (undefined1  [8])0x0) {
      LOCK();
      (((QArrayData *)auVar9)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)auVar9)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QArrayData *)auVar9)->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)auVar9,4,0x10);
      }
    }
  }
LAB_0057ba29:
  if (*(QModelIndex **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListWidgetItem::setData(int role, const QVariant &value)
{
    bool found = false;
    role = (role == Qt::EditRole ? Qt::DisplayRole : role);
    for (int i = 0; i < d->values.size(); ++i) {
        if (d->values.at(i).role == role) {
            if (d->values.at(i).value == value)
                return;
            d->values[i].value = value;
            found = true;
            break;
        }
    }
    if (!found)
        d->values.append(QWidgetItemData(role, value));
    if (QListModel *model = listModel()) {
        const QList<int> roles((role == Qt::DisplayRole)
                                       ? QList<int>({ Qt::DisplayRole, Qt::EditRole })
                                       : QList<int>({ role }));
        model->itemChanged(this, roles);
    }
}